

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_printf_as_uint32_array(array_container_t *v,uint32_t base)

{
  int in_ESI;
  int *in_RDI;
  int i;
  int local_10;
  
  if (*in_RDI != 0) {
    printf("%u",(ulong)((uint)**(ushort **)(in_RDI + 2) + in_ESI));
    for (local_10 = 1; local_10 < *in_RDI; local_10 = local_10 + 1) {
      printf(",%u",(ulong)((uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_10 * 2) + in_ESI));
    }
  }
  return;
}

Assistant:

void array_container_printf_as_uint32_array(const array_container_t *v,
                                            uint32_t base) {
    if (v->cardinality == 0) {
        return;
    }
    printf("%u", v->array[0] + base);
    for (int i = 1; i < v->cardinality; ++i) {
        printf(",%u", v->array[i] + base);
    }
}